

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O1

void __thiscall Highs::reportSolvedLpQpStats(Highs *this)

{
  HighsLogOptions *log_options_;
  double dVar1;
  uint uVar2;
  _Alloc_hider __nbytes;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf;
  void *extraout_RDX_02;
  double dVar3;
  double dual_objective_value;
  string local_38;
  
  if ((this->options_).super_HighsOptionsStruct.output_flag == true) {
    log_options_ = &(this->options_).super_HighsOptionsStruct.log_options;
    if ((this->model_).lp_.model_name_._M_string_length != 0) {
      highsLogUser(log_options_,kInfo,"Model name          : %s\n",
                   (this->model_).lp_.model_name_._M_dataplus._M_p);
    }
    utilModelStatusToString_abi_cxx11_(&local_38,this->model_status_);
    __nbytes._M_p = local_38._M_dataplus._M_p;
    highsLogUser(log_options_,kInfo,"Model status        : %s\n");
    __buf = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
      __buf = extraout_RDX_00;
    }
    if ((this->info_).super_HighsInfoStruct.valid == true) {
      if ((this->info_).super_HighsInfoStruct.simplex_iteration_count != 0) {
        highsLogUser(log_options_,kInfo,"Simplex   iterations: %d\n");
      }
      if ((this->info_).super_HighsInfoStruct.ipm_iteration_count != 0) {
        highsLogUser(log_options_,kInfo,"IPM       iterations: %d\n");
      }
      if ((this->info_).super_HighsInfoStruct.crossover_iteration_count != 0) {
        highsLogUser(log_options_,kInfo,"Crossover iterations: %d\n");
      }
      if ((this->info_).super_HighsInfoStruct.pdlp_iteration_count != 0) {
        highsLogUser(log_options_,kInfo,"PDLP      iterations: %d\n");
      }
      uVar2 = (this->info_).super_HighsInfoStruct.qp_iteration_count;
      __nbytes._M_p = (pointer)(ulong)uVar2;
      if (uVar2 != 0) {
        highsLogUser(log_options_,kInfo,"QP ASM    iterations: %d\n");
      }
      highsLogUser(log_options_,kInfo,"Objective value     : %17.10e\n",
                   (this->info_).super_HighsInfoStruct.objective_function_value);
      __buf = extraout_RDX_01;
    }
    if (((this->solution_).dual_valid == true) && ((this->model_).hessian_.dim_ == 0)) {
      if ((this->model_).hessian_.dim_ == 0) {
        computeDualObjectiveValue(&(this->model_).lp_,&this->solution_,(double *)&local_38);
      }
      dVar1 = (this->info_).super_HighsInfoStruct.objective_function_value;
      dVar3 = ABS(dVar1);
      if (dVar3 <= 1.0) {
        dVar3 = 1.0;
      }
      highsLogUser(log_options_,kInfo,"Relative P-D gap    : %17.10e\n",
                   ABS(dVar1 - (double)local_38._M_dataplus._M_p) / dVar3);
      __buf = extraout_RDX_02;
    }
    if ((this->options_).super_HighsOptionsStruct.timeless_log == false) {
      HighsTimer::read(&this->timer_,0,__buf,(size_t)__nbytes._M_p);
      highsLogUser(log_options_,kInfo,"HiGHS run time      : %13.2f\n");
    }
  }
  return;
}

Assistant:

void Highs::reportSolvedLpQpStats() {
  if (!options_.output_flag) return;
  HighsLogOptions& log_options = options_.log_options;
  if (this->model_.lp_.model_name_.length())
    highsLogUser(log_options, HighsLogType::kInfo, "Model name          : %s\n",
                 model_.lp_.model_name_.c_str());
  highsLogUser(log_options, HighsLogType::kInfo, "Model status        : %s\n",
               modelStatusToString(model_status_).c_str());
  if (info_.valid) {
    if (info_.simplex_iteration_count)
      highsLogUser(log_options, HighsLogType::kInfo,
                   "Simplex   iterations: %" HIGHSINT_FORMAT "\n",
                   info_.simplex_iteration_count);
    if (info_.ipm_iteration_count)
      highsLogUser(log_options, HighsLogType::kInfo,
                   "IPM       iterations: %" HIGHSINT_FORMAT "\n",
                   info_.ipm_iteration_count);
    if (info_.crossover_iteration_count)
      highsLogUser(log_options, HighsLogType::kInfo,
                   "Crossover iterations: %" HIGHSINT_FORMAT "\n",
                   info_.crossover_iteration_count);
    if (info_.pdlp_iteration_count)
      highsLogUser(log_options, HighsLogType::kInfo,
                   "PDLP      iterations: %" HIGHSINT_FORMAT "\n",
                   info_.pdlp_iteration_count);
    if (info_.qp_iteration_count)
      highsLogUser(log_options, HighsLogType::kInfo,
                   "QP ASM    iterations: %" HIGHSINT_FORMAT "\n",
                   info_.qp_iteration_count);
    highsLogUser(log_options, HighsLogType::kInfo,
                 "Objective value     : %17.10e\n",
                 info_.objective_function_value);
  }
  if (solution_.dual_valid && !this->model_.isQp()) {
    double dual_objective_value;
    HighsStatus status = this->getDualObjectiveValue(dual_objective_value);
    assert(status == HighsStatus::kOk);
    const double relative_primal_dual_gap =
        std::fabs(info_.objective_function_value - dual_objective_value) /
        std::max(1.0, std::fabs(info_.objective_function_value));
    highsLogUser(log_options, HighsLogType::kInfo,
                 "Relative P-D gap    : %17.10e\n", relative_primal_dual_gap);
  }
  if (!options_.timeless_log) {
    double run_time = timer_.read();
    highsLogUser(log_options, HighsLogType::kInfo,
                 "HiGHS run time      : %13.2f\n", run_time);
  }
}